

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O2

Vec_Str_t * Pla_ReadPlaBody(char *pBuffer,char *pLimit,Pla_File_t Type)

{
  char cVar1;
  char Entry;
  Vec_Str_t *p;
  char *pcVar2;
  
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 10000;
  p->nSize = 0;
  pcVar2 = (char *)malloc(10000);
  p->pArray = pcVar2;
  do {
    if (pLimit <= pBuffer) {
      return p;
    }
    cVar1 = *pBuffer;
    if (cVar1 == '.') {
      cVar1 = '.';
      while ((cVar1 != '\0' && (cVar1 != '\n'))) {
        pcVar2 = pBuffer + 1;
        pBuffer = pBuffer + 1;
        cVar1 = *pcVar2;
      }
    }
    Entry = '\x01';
    switch(cVar1) {
    case '-':
    case '2':
switchD_00366b73_caseD_2d:
      Entry = '\0';
      break;
    case '.':
    case '/':
      goto switchD_00366b73_caseD_2e;
    case '0':
      break;
    case '1':
      Entry = '\x02';
      break;
    default:
      if (cVar1 == '~') {
        if (PLA_FILE_F < Type) {
          if (Type == PLA_FILE_FR) goto switchD_00366b73_caseD_2d;
          if (Type != PLA_FILE_FDR) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/pla/plaRead.c"
                          ,0x98,"Vec_Str_t *Pla_ReadPlaBody(char *, char *, Pla_File_t)");
          }
          Entry = '\x03';
        }
        break;
      }
      goto switchD_00366b73_caseD_2e;
    }
    Vec_StrPush(p,Entry);
switchD_00366b73_caseD_2e:
    pBuffer = pBuffer + 1;
  } while( true );
}

Assistant:

Vec_Str_t * Pla_ReadPlaBody( char * pBuffer, char * pLimit, Pla_File_t Type )
{
    char * pTemp;
    Vec_Str_t * vLits;
    vLits = Vec_StrAlloc( 10000 );
    for ( pTemp = pBuffer; pTemp < pLimit; pTemp++ )
    {
        if ( *pTemp == '.' )
            while ( *pTemp && *pTemp != '\n' )
                pTemp++;
        if ( *pTemp == '0' )
            Vec_StrPush( vLits, (char)PLA_LIT_ZERO );
        else if ( *pTemp == '1' )
            Vec_StrPush( vLits, (char)PLA_LIT_ONE );
        else if ( *pTemp == '-' || *pTemp == '2' )
            Vec_StrPush( vLits, (char)PLA_LIT_DASH );
        else if ( *pTemp == '~' ) // no meaning
        {
            if ( Type == PLA_FILE_F || Type == PLA_FILE_FD )
                Vec_StrPush( vLits, (char)PLA_LIT_ZERO );
            else if ( Type == PLA_FILE_FR )
                Vec_StrPush( vLits, (char)PLA_LIT_DASH );
            else if ( Type == PLA_FILE_FDR )
                Vec_StrPush( vLits, (char)PLA_LIT_FULL );
            else assert( 0 );
        }
    }
    return vLits;
}